

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::(anonymous_namespace)::
     ScalarValueToVertexAttribute<std::array<unsigned_char,3ul>>
               (Value *value,string *name,VertexAttributeFormat format,VertexAttribute *dst,
               string *err)

{
  undefined2 *puVar1;
  array<unsigned_char,_3UL> *paVar2;
  ostream *poVar3;
  undefined4 in_register_00000014;
  string *psVar4;
  ostringstream ss_e;
  long *local_1c0;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  psVar4 = (string *)CONCAT44(in_register_00000014,format);
  paVar2 = tinyusdz::value::Value::as<std::array<unsigned_char,3ul>>(value,false);
  if (paVar2 != (array<unsigned_char,_3UL> *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(psVar4 + 0x30),3);
    puVar1 = *(undefined2 **)(psVar4 + 0x30);
    *(uchar *)(puVar1 + 1) = paVar2->_M_elems[2];
    *puVar1 = *(undefined2 *)paVar2->_M_elems;
    *(undefined4 *)(psVar4 + 0x28) = 0;
    *(undefined8 *)(psVar4 + 0x20) = 0x100000007;
    *(undefined4 *)(psVar4 + 0x60) = 0;
    ::std::__cxx11::string::_M_assign(psVar4);
    if (*(long *)(psVar4 + 0x50) != *(long *)(psVar4 + 0x48)) {
      *(long *)(psVar4 + 0x50) = *(long *)(psVar4 + 0x48);
    }
    if (paVar2 != (array<unsigned_char,_3UL> *)0x0) goto LAB_0036bfef;
  }
  ::std::__cxx11::ostringstream::ostringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
             ,0x5b);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"ScalarValueToVertexAttribute",0x1c);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
  poVar3 = (ostream *)::std::ostream::operator<<(local_1a0,0x4a2);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"[Internal error] value is not scalar-typed value.",0x31);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  if (dst != (VertexAttribute *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)dst,(ulong)local_1c0);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  ::std::ios_base::~ios_base(local_130);
LAB_0036bfef:
  return paVar2 != (array<unsigned_char,_3UL> *)0x0;
}

Assistant:

bool ScalarValueToVertexAttribute(const value::Value &value,
                                  const std::string &name,
                                  const VertexAttributeFormat format,
                                  VertexAttribute &dst, std::string *err) {
  if (VertexAttributeFormatSize(format) != sizeof(UnderlyingTy)) {
    PUSH_ERROR_AND_RETURN("format size mismatch.");
    return false;
  }

  if (auto pv = value.as<UnderlyingTy>()) {
    dst.data.resize(sizeof(UnderlyingTy));
    memcpy(dst.data.data(), pv, sizeof(UnderlyingTy));

    dst.elementSize = 1;
    dst.stride = 0;
    dst.format = format;
    dst.variability = VertexVariability::Constant;
    dst.name = name;
    dst.indices.clear();
    return true;
  }

  PUSH_ERROR_AND_RETURN("[Internal error] value is not scalar-typed value.");
}